

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O0

int read_word(char *str,char *word,int word_size)

{
  bool bVar1;
  int len;
  int word_cur;
  int word_size_local;
  char *word_local;
  char *str_local;
  int local_4;
  
  word_cur = 0;
  len = 0;
  str_local = str;
  while( true ) {
    bVar1 = true;
    if ((*str_local != ' ') && (bVar1 = true, *str_local != '\t')) {
      bVar1 = *str_local == '\n';
    }
    if (!bVar1) break;
    str_local = str_local + 1;
    len = len + 1;
  }
  if (*str_local == '\0') {
    *word = '\0';
    local_4 = len;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (((*str_local != ' ') && (bVar1 = false, *str_local != '\t')) &&
         (bVar1 = false, *str_local != '\n')) {
        bVar1 = *str_local != '\0';
      }
      if (!bVar1) {
        if (word_size <= word_cur) {
          word_cur = word_cur + -1;
        }
        if (word != (char *)0x0) {
          word[word_cur] = '\0';
        }
        return len;
      }
      if ((word != (char *)0x0) && (word_size <= word_cur)) break;
      if (word != (char *)0x0) {
        word[word_cur] = *str_local;
      }
      word_cur = word_cur + 1;
      str_local = str_local + 1;
      len = len + 1;
    }
    if ((0 < word_size) && (word != (char *)0x0)) {
      word[word_size + -1] = '\0';
    }
    local_4 = word_cur;
  }
  return local_4;
}

Assistant:

static int read_word(char *str, char *word, int word_size) 
{
   int word_cur = 0;
   int len = 0;
   while (*str == ' ' || *str == '\t' || *str == '\n') {
      str++;
      len++;
   }
   if (*str == '\0') {
      *word = '\0';
      return len;
   }
   while (*str != ' ' && *str != '\t' && *str != '\n' && *str != '\0') {
      if (word && word_cur >= word_size) {
         if (word_size > 0 && word)
            word[word_size-1] = '\0';
         return word_cur;
      }
      if (word)
         word[word_cur] = *str;
      word_cur++;
      str++;
      len++;
   }
   if (word_cur >= word_size)
      word_cur--;
   if (word)
      word[word_cur] = '\0';
   return len;
}